

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# actor.h
# Opt level: O0

DVector3 * __thiscall
AActor::Vec3Offset(DVector3 *__return_storage_ptr__,AActor *this,double dx,double dy,double dz,
                  bool absolute)

{
  double dVar1;
  double dVar2;
  double dVar3;
  undefined1 local_48 [8];
  DVector2 v;
  bool absolute_local;
  double dz_local;
  double dy_local;
  double dx_local;
  AActor *this_local;
  
  v.Y._7_1_ = absolute;
  if (absolute) {
    dVar1 = X(this);
    dVar2 = Y(this);
    dVar3 = Z(this);
    TVector3<double>::TVector3(__return_storage_ptr__,dVar1 + dx,dVar2 + dy,dVar3 + dz);
  }
  else {
    dVar1 = X(this);
    dVar2 = Y(this);
    P_GetOffsetPosition(dVar1,dVar2,dx,dy);
    dVar1 = Z(this);
    TVector3<double>::TVector3(__return_storage_ptr__,(Vector2 *)local_48,dVar1 + dz);
  }
  return __return_storage_ptr__;
}

Assistant:

DVector3 Vec3Offset(double dx, double dy, double dz, bool absolute = false)
	{
		if (absolute)
		{
			return { X() + dx, Y() + dy, Z() + dz };
		}
		else
		{
			DVector2 v = P_GetOffsetPosition(X(), Y(), dx, dy);
			return DVector3(v, Z() + dz);
		}
	}